

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

uint ON_SubDEdgeChain::RefineEdgeChains
               (ON_SimpleArray<ON_SubDEdgePtr> *unconditional_edge_chains,bool bOrdinarySmoothChains
               ,bool bOrdinaryCreaseChains,ON_SimpleArray<ON_SubDEdgePtr> *refined_edge_chains)

{
  ON_SubDEdgeTag OVar1;
  unsigned_short uVar2;
  uint uVar3;
  long lVar4;
  ON_SubDEdgeSharpness OVar5;
  _func_int **pp_Var6;
  bool bVar7;
  bool bVar8;
  uint uVar9;
  ON_SubDEdge *edge;
  ON_SubDEdge *pOVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  float fVar15;
  float fVar16;
  ON_SubDEdgePtr eptr;
  ON_SimpleArray<ON_SubDEdgePtr> local_unconditional_edge_chains;
  float local_60;
  ON_SubDEdgePtr local_50;
  ON_SimpleArray<ON_SubDEdgePtr> local_48;
  
  uVar3 = unconditional_edge_chains->m_count;
  if ((uVar3 == 0) || (unconditional_edge_chains->m_a != refined_edge_chains->m_a)) {
    if (((ulong)(uint)refined_edge_chains->m_count != 0) &&
       (7 < refined_edge_chains->m_a[(ulong)(uint)refined_edge_chains->m_count - 1].m_ptr)) {
      ON_SimpleArray<ON_SubDEdgePtr>::Append(refined_edge_chains,&ON_SubDEdgePtr::Null);
    }
    if (uVar3 == 0) {
      uVar12 = 0;
    }
    else {
      uVar12 = 0;
      uVar11 = 0;
      uVar14 = 0;
      do {
        uVar13 = (uint)uVar14;
        local_48._vptr_ON_SimpleArray = (_func_int **)unconditional_edge_chains->m_a[uVar14].m_ptr;
        pOVar10 = (ON_SubDEdge *)((ulong)local_48._vptr_ON_SimpleArray & 0xfffffffffffffff8);
        if (pOVar10 != (ON_SubDEdge *)0x0) {
          ON_SimpleArray<ON_SubDEdgePtr>::Append(refined_edge_chains,(ON_SubDEdgePtr *)&local_48);
          OVar1 = pOVar10->m_edge_tag;
          uVar2 = pOVar10->m_face_count;
          if (((OVar1 == SmoothX) || (OVar1 == Smooth)) &&
             (bVar7 = ON_SubDEdge::IsSharp(pOVar10), pp_Var6 = local_48._vptr_ON_SimpleArray, bVar7)
             ) {
            if ((ON_SubDEdge *)((ulong)local_48._vptr_ON_SimpleArray & 0xfffffffffffffff8) ==
                (ON_SubDEdge *)0x0) {
              local_60 = ON_SubDEdgeSharpness::Nan.m_edge_sharpness[1];
            }
            else {
              OVar5 = ON_SubDEdge::Sharpness
                                ((ON_SubDEdge *)
                                 ((ulong)local_48._vptr_ON_SimpleArray & 0xfffffffffffffff8),false);
              local_60 = OVar5.m_edge_sharpness[1];
              if (((ulong)pp_Var6 & 1) != 0) {
                local_60 = OVar5.m_edge_sharpness[0];
              }
            }
            bVar7 = true;
          }
          else {
            local_60 = 0.0;
            bVar7 = false;
          }
          uVar11 = uVar13 + 1;
          if (uVar11 < uVar3) {
            do {
              uVar14 = unconditional_edge_chains->m_a[uVar11].m_ptr;
              pOVar10 = (ON_SubDEdge *)(uVar14 & 0xfffffffffffffff8);
              local_50.m_ptr = uVar14;
              if (((pOVar10 == (ON_SubDEdge *)0x0) || (uVar2 != pOVar10->m_face_count)) ||
                 ((OVar1 == Smooth || OVar1 == SmoothX) !=
                  (pOVar10->m_edge_tag == SmoothX || pOVar10->m_edge_tag == Smooth))) break;
              if (bVar7) {
                bVar8 = ON_SubDEdge::IsSharp(pOVar10);
                if (!bVar8) break;
                OVar5 = ON_SubDEdge::Sharpness(pOVar10,false);
                fVar15 = OVar5.m_edge_sharpness[0];
                fVar16 = OVar5.m_edge_sharpness[1];
                if ((uVar14 & 1) != 0) {
                  fVar15 = OVar5.m_edge_sharpness[1];
                  fVar16 = OVar5.m_edge_sharpness[0];
                }
                bVar8 = NAN(local_60);
                if ((local_60 != fVar15) || (local_60 = fVar16, bVar8 || NAN(fVar15))) break;
              }
              ON_SimpleArray<ON_SubDEdgePtr>::Append(refined_edge_chains,&local_50);
              if (((local_50.m_ptr & 0xfffffffffffffff8) == 0) ||
                 (lVar4 = *(long *)((local_50.m_ptr & 0xfffffffffffffff8) + 0x80 +
                                   (ulong)(~(uint)local_50.m_ptr & 1) * 8), lVar4 == 0)) {
LAB_005ec8d8:
                uVar11 = uVar11 + 1;
                break;
              }
              if ((OVar1 == SmoothX) || (OVar1 == Smooth)) {
                if ((bOrdinarySmoothChains) &&
                   ((*(char *)(lVar4 + 0x60) != '\x01' ||
                    ((!bVar7 && (*(short *)(lVar4 + 0x68) != 4)))))) goto LAB_005ec8d8;
              }
              else if ((bOrdinaryCreaseChains) && (*(char *)(lVar4 + 0x60) != '\x02'))
              goto LAB_005ec8d8;
              uVar11 = uVar11 + 1;
            } while (uVar11 < uVar3);
          }
          uVar12 = uVar12 + 1;
          ON_SimpleArray<ON_SubDEdgePtr>::Append(refined_edge_chains,&ON_SubDEdgePtr::Null);
        }
        uVar9 = uVar13 + 1;
        if (uVar13 < uVar11) {
          uVar9 = uVar11;
        }
        uVar14 = (ulong)uVar9;
      } while (uVar9 < uVar3);
    }
  }
  else {
    local_48._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00816d78;
    local_48.m_a = (ON_SubDEdgePtr *)0x0;
    local_48.m_count = 0;
    local_48.m_capacity = 0;
    ON_SimpleArray<ON_SubDEdgePtr>::operator=(&local_48,unconditional_edge_chains);
    if (-1 < refined_edge_chains->m_capacity) {
      refined_edge_chains->m_count = 0;
    }
    uVar12 = RefineEdgeChains(&local_48,bOrdinarySmoothChains,bOrdinaryCreaseChains,
                              refined_edge_chains);
    ON_SimpleArray<ON_SubDEdgePtr>::~ON_SimpleArray(&local_48);
  }
  return uVar12;
}

Assistant:

unsigned ON_SubDEdgeChain::RefineEdgeChains(
  const ON_SimpleArray<ON_SubDEdgePtr>& unconditional_edge_chains,
  bool bOrdinarySmoothChains,
  bool bOrdinaryCreaseChains,
  ON_SimpleArray<ON_SubDEdgePtr>& refined_edge_chains
)
{
  const unsigned unconditional_edge_count = unconditional_edge_chains.UnsignedCount();

  if (unconditional_edge_count > 0 && unconditional_edge_chains.Array() == refined_edge_chains.Array())
  {
    // copy unconditional_edge_chains[] to a local array so we can modify refined_edge_chains[]
    const ON_SimpleArray<ON_SubDEdgePtr> local_unconditional_edge_chains(unconditional_edge_chains);
    refined_edge_chains.SetCount(0); // In this uniquecase we do not append because in[ut array = output array.
    return ON_SubDEdgeChain::RefineEdgeChains(
      local_unconditional_edge_chains,
      bOrdinarySmoothChains,
      bOrdinaryCreaseChains,
      refined_edge_chains
    );
  }

  if (refined_edge_chains.UnsignedCount() > 0 && refined_edge_chains.Last()->IsNotNull())
  {
    // Append a null separator to refined_edge_chains[].
    refined_edge_chains.Append(ON_SubDEdgePtr::Null);
  }

  unsigned int refined_chain_count = 0;
  unsigned i1 = 0U;
  for (unsigned i0 = 0; i0 < unconditional_edge_count; i0 = (i0 < i1) ? i1 : (i0 + 1U))
  {
    const ON_SubDEdgePtr eptr0 = unconditional_edge_chains[i0];
    const ON_SubDEdge* e0 = eptr0.Edge();
    if (nullptr == e0)
      continue;

    refined_edge_chains.Append(eptr0);

    const unsigned short edge_face_count = e0->m_face_count;
    const bool bSmoothChain = e0->IsSmooth();
    const bool bSharpChain = bSmoothChain ? e0->IsSharp() : false;
    ON_SubDEdgeSharpness prev_sharpness = bSharpChain ? eptr0.RelativeSharpness(false) : ON_SubDEdgeSharpness::Smooth;

    for (i1 = i0 + 1; i1 < unconditional_edge_count; ++i1)
    {
      const ON_SubDEdgePtr eptr = unconditional_edge_chains[i1];
      const ON_SubDEdge* e = eptr.Edge();
      if (nullptr == e)
        break;
      if (edge_face_count != e->m_face_count)
        break;
      if (bSmoothChain != e->IsSmooth())
        break;
      if (bSharpChain)
      {
        if (false == e->IsSharp())
          break;
        const ON_SubDEdgeSharpness s = eptr.RelativeSharpness(false);
        if (false == (prev_sharpness.EndSharpness(1) == s.EndSharpness(0)))
          break;
        prev_sharpness = s;
      }

      // Add eptr to current chain
      refined_edge_chains.Append(eptr);

      const ON_SubDVertex* v = eptr.RelativeVertex(1);
      if (nullptr == v)
      {
        ++i1;
        break;
      }

      if (bSmoothChain)
      {
        if (false == bOrdinarySmoothChains)
          continue;
        if (false == v->IsSmooth())
        {
          ++i1;
          break;
        }        
        if (false == bSharpChain && 4 != v->m_edge_count)
        {
          ++i1;
          break;
        }
      }
      else
      {
        if (false == bOrdinaryCreaseChains)
          continue;
        if (false == v->IsCrease())
        {
          ++i1;
          break;
        }
      }
    }

    // finished with this chain.
    ++refined_chain_count;
    refined_edge_chains.Append(ON_SubDEdgePtr::Null);
  }

  return refined_chain_count;
}